

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_add_tlmarker(int tileno,opj_codestream_info_t *cstr_info,unsigned_short type,int pos,
                     int len)

{
  void *pvVar1;
  undefined2 *puVar2;
  long lVar3;
  int in_ECX;
  undefined2 in_DX;
  long in_RSI;
  int in_EDI;
  undefined4 in_R8D;
  opj_marker_info_t *marker;
  
  if (*(int *)(*(long *)(in_RSI + 0x68) + (long)in_EDI * 0x260 + 0x250) <
      *(int *)(*(long *)(in_RSI + 0x68) + (long)in_EDI * 0x260 + 0x240) + 1) {
    *(int *)(*(long *)(in_RSI + 0x68) + (long)in_EDI * 0x260 + 0x250) =
         (int)((float)*(int *)(*(long *)(in_RSI + 0x68) + (long)in_EDI * 0x260 + 0x250) * 1.0) + 100
    ;
    pvVar1 = realloc(*(void **)(*(long *)(in_RSI + 0x68) + (long)in_EDI * 0x260 + 0x248),
                     (long)*(int *)(in_RSI + 0x58));
    *(void **)(*(long *)(in_RSI + 0x68) + (long)in_EDI * 0x260 + 0x248) = pvVar1;
  }
  puVar2 = (undefined2 *)
           (*(long *)(*(long *)(in_RSI + 0x68) + (long)in_EDI * 0x260 + 0x248) +
           (long)*(int *)(*(long *)(in_RSI + 0x68) + (long)in_EDI * 0x260 + 0x240) * 0x18);
  *puVar2 = in_DX;
  *(long *)(puVar2 + 4) = (long)in_ECX;
  *(undefined4 *)(puVar2 + 8) = in_R8D;
  lVar3 = *(long *)(in_RSI + 0x68) + (long)in_EDI * 0x260;
  *(int *)(lVar3 + 0x240) = *(int *)(lVar3 + 0x240) + 1;
  return;
}

Assistant:

static void j2k_add_tlmarker( int tileno, opj_codestream_info_t *cstr_info, unsigned short int type, int pos, int len)
{
	opj_marker_info_t *marker;

	assert(cstr_info != 00);

	/* expand the list? */
	if ((cstr_info->tile[tileno].marknum + 1) > cstr_info->tile[tileno].maxmarknum) {
		cstr_info->tile[tileno].maxmarknum = 100 + (int) ((float) cstr_info->tile[tileno].maxmarknum * 1.0F);
		cstr_info->tile[tileno].marker = (opj_marker_info_t*)opj_realloc(cstr_info->tile[tileno].marker, cstr_info->maxmarknum);
	}

	marker = &(cstr_info->tile[tileno].marker[cstr_info->tile[tileno].marknum]);

	/* add the marker */
	marker->type = type;
	marker->pos = pos;
	marker->len = len;
	cstr_info->tile[tileno].marknum++;
}